

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void finish(audit_regressor_data *dat)

{
  ostream *poVar1;
  
  if (dat->values_audited < dat->loaded_regressor_values) {
    poVar1 = std::operator<<(&(dat->all->trace_message).super_ostream,
                             "Note: for some reason audit couldn\'t find all regressor values in dataset ("
                            );
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," of ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," found).");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void finish(audit_regressor_data& dat)
{
  if (dat.values_audited < dat.loaded_regressor_values)
    dat.all->trace_message << "Note: for some reason audit couldn't find all regressor values in dataset ("
                           << dat.values_audited << " of " << dat.loaded_regressor_values << " found)." << endl;
}